

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::~Clipper(Clipper *this,void **vtt)

{
  void **vtt_local;
  Clipper *this_local;
  
  this->_vptr_Clipper = (_func_int **)*vtt;
  *(void **)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]) = vtt[1];
  (*this->_vptr_Clipper[2])();
  DisposeScanbeamList(this);
  std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::~vector
            (&this->m_HorizJoins);
  std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::~vector
            (&this->m_Joins);
  std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::~vector
            (&this->m_PolyOuts);
  return;
}

Assistant:

Clipper::~Clipper() //destructor
{
  Clear();
  DisposeScanbeamList();
}